

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O1

void method_destroy(method_conflict m)

{
  method_impl_interface_destroy p_Var1;
  
  if (m != (method_conflict)0x0) {
    if ((m->iface != (method_interface)0x0) &&
       (p_Var1 = m->iface->destroy, p_Var1 != (method_impl_interface_destroy)0x0)) {
      (*p_Var1)(m,m->impl);
    }
    if (m->s != (signature)0x0) {
      signature_destroy(m->s);
    }
    if (m->name != (char *)0x0) {
      free(m->name);
    }
    free(m);
    return;
  }
  return;
}

Assistant:

void method_destroy(method m)
{
	if (m)
	{
		if (m->iface && m->iface->destroy)
		{
			m->iface->destroy(m, m->impl);
		}

		if (m->s)
		{
			signature_destroy(m->s);
		}

		if (m->name)
		{
			free(m->name);
		}

		free(m);
	}
}